

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

void deqp::gles31::Functional::generateVariableTypeResourceNames
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *resources,string *name,VarType *type,deUint32 resourceNameGenerationFlags)

{
  Type TVar1;
  StructType *pSVar2;
  long lVar3;
  uint resourceNameGenerationFlags_00;
  long lVar4;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  resourceNameGenerationFlags_00 = resourceNameGenerationFlags & 0xfffffffe;
  TVar1 = type->m_type;
  if (TVar1 == TYPE_STRUCT) {
    pSVar2 = (type->m_data).structPtr;
    lVar3 = 0x20;
    for (lVar4 = 0;
        lVar4 < (int)(((long)(pSVar2->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pSVar2->m_members).
                            super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar4 = lVar4 + 1) {
      std::operator+(&local_90,name,".");
      std::operator+(&local_b0,&local_90,
                     *(char **)((long)(pSVar2->m_members).
                                      super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x20));
      generateVariableTypeResourceNames
                (resources,&local_b0,
                 (VarType *)
                 ((long)&(((pSVar2->m_members).
                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus._M_p +
                 lVar3),resourceNameGenerationFlags_00);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      lVar3 = lVar3 + 0x38;
    }
  }
  else if (TVar1 == TYPE_ARRAY) {
    TVar1 = ((type->m_data).array.elementType)->m_type;
    if ((resourceNameGenerationFlags & 2) != 0 && TVar1 == TYPE_BASIC) goto LAB_005d71e0;
    if ((resourceNameGenerationFlags & 1) == 0 && TVar1 != TYPE_BASIC) {
      for (local_b4 = 0; local_b4 < (type->m_data).array.size; local_b4 = local_b4 + 1) {
        std::operator+(&local_50,name,"[");
        de::toString<int>(&local_70,&local_b4);
        std::operator+(&local_90,&local_50,&local_70);
        std::operator+(&local_b0,&local_90,"]");
        generateVariableTypeResourceNames
                  (resources,&local_b0,(type->m_data).array.elementType,
                   resourceNameGenerationFlags_00);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      std::operator+(&local_b0,name,"[0]");
      generateVariableTypeResourceNames
                (resources,&local_b0,(type->m_data).array.elementType,resourceNameGenerationFlags_00
                );
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else if (TVar1 == TYPE_BASIC) {
LAB_005d71e0:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(resources,name);
    return;
  }
  return;
}

Assistant:

void generateVariableTypeResourceNames (std::vector<std::string>& resources, const std::string& name, const glu::VarType& type, deUint32 resourceNameGenerationFlags)
{
	DE_ASSERT((resourceNameGenerationFlags & (~RESOURCE_NAME_GENERATION_FLAG_MASK)) == 0);

	// remove top-level flag from children
	const deUint32 childFlags = resourceNameGenerationFlags & ~((deUint32)RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE);

	if (type.isBasicType())
		resources.push_back(name);
	else if (type.isStructType())
	{
		const glu::StructType* structType = type.getStructPtr();
		for (int ndx = 0; ndx < structType->getNumMembers(); ++ndx)
			generateVariableTypeResourceNames(resources, name + "." + structType->getMember(ndx).getName(), structType->getMember(ndx).getType(), childFlags);
	}
	else if (type.isArrayType())
	{
		// Bottom-level arrays of basic types of a transform feedback variable will produce only the first
		// element but without the trailing "[0]"
		if (type.getElementType().isBasicType() &&
			(resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TRANSFORM_FEEDBACK_VARIABLE) != 0)
		{
			resources.push_back(name);
		}
		// Bottom-level arrays of basic types and SSBO top-level arrays of any type procude only first element
		else if (type.getElementType().isBasicType() ||
				 (resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE) != 0)
		{
			generateVariableTypeResourceNames(resources, name + "[0]", type.getElementType(), childFlags);
		}
		// Other arrays of aggregate types are expanded
		else
		{
			for (int ndx = 0; ndx < type.getArraySize(); ++ndx)
				generateVariableTypeResourceNames(resources, name + "[" + de::toString(ndx) + "]", type.getElementType(), childFlags);
		}
	}
	else
		DE_ASSERT(false);
}